

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O2

void __thiscall
ParserTestDuplicateRuleInDifferentSubninjasWithInclude::Run
          (ParserTestDuplicateRuleInDifferentSubninjasWithInclude *this)

{
  VirtualFileSystem *this_00;
  Test *this_01;
  bool condition;
  string err;
  ManifestParser parser;
  allocator<char> local_b1;
  string local_b0;
  string local_90;
  ManifestParser local_70;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"rules.ninja",(allocator<char> *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"rule cat\n  command = cat\n",&local_b1);
  this_00 = &(this->super_ParserTest).fs_;
  VirtualFileSystem::Create(this_00,(string *)&local_70,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"test.ninja",(allocator<char> *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"include rules.ninja\nbuild x : cat\n",&local_b1);
  VirtualFileSystem::Create(this_00,(string *)&local_70,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_70);
  ManifestParser::ManifestParser
            (&local_70,&(this->super_ParserTest).state,(FileReader *)this_00,
             (ManifestParserOptions)0x0);
  this_01 = g_current_test;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"include rules.ninja\nsubninja test.ninja\nbuild y : cat\n",
             &local_b1);
  condition = ManifestParser::ParseTest(&local_70,&local_90,&local_b0);
  testing::Test::Check
            (this_01,condition,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
             ,0x39d,
             "parser.ParseTest(\"include rules.ninja\\n\" \"subninja test.ninja\\n\" \"build y : cat\\n\", &err)"
            );
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

TEST_F(ParserTest, DuplicateRuleInDifferentSubninjasWithInclude) {
  // Test that rules are scoped to subninjas even with includes.
  fs_.Create("rules.ninja", "rule cat\n"
                         "  command = cat\n");
  fs_.Create("test.ninja", "include rules.ninja\n"
                         "build x : cat\n");
  ManifestParser parser(&state, &fs_);
  string err;
  EXPECT_TRUE(parser.ParseTest("include rules.ninja\n"
                                "subninja test.ninja\n"
                                "build y : cat\n", &err));
}